

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v10::detail::write<char,fmt::v10::appender>
          (detail *this,appender out,char *s,format_specs<char> *specs,locale_ref param_4)

{
  appender aVar1;
  char *pcVar2;
  basic_string_view<char> s_00;
  
  if (s[8] == '\x11') {
    aVar1 = write_ptr<char,fmt::v10::appender,unsigned_long>
                      ((appender)this,
                       (unsigned_long)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       (format_specs<char> *)s);
    return (appender)aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  if (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
      (buffer<char> *)0x0) {
    pcVar2 = (char *)strlen((char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                    container);
    s_00.size_ = (size_t)s;
    s_00.data_ = pcVar2;
    aVar1 = write<char,fmt::v10::appender>(this,out,s_00,(format_specs<char> *)param_4.locale_);
    return (appender)aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  throw_format_error("string pointer is null");
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  if (specs.type == presentation_type::pointer)
    return write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
  if (!s) throw_format_error("string pointer is null");
  return write(out, basic_string_view<Char>(s), specs, {});
}